

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O2

void __thiscall ParserException::ParserException(ParserException *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"parsing error",&local_31);
  ANTLRException::ANTLRException(&this->super_ANTLRException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_ANTLRException = &PTR__ANTLRException_00213bc0;
  return;
}

Assistant:

ParserException::ParserException()
: ANTLRException("parsing error")
{}